

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_by_value.cpp
# Opt level: O0

void h(int *i,int s)

{
  ostream *poVar1;
  int in_ESI;
  int *in_RDI;
  rep_conflict rVar2;
  scoped_lock l_1;
  scoped_lock l;
  spin_mutex_t *in_stack_ffffffffffffff28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff30;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff38;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff40;
  duration<double,_std::ratio<1L,_1L>_> local_50 [2];
  undefined8 local_40;
  rep local_38;
  duration<double,_std::ratio<1L,_1L>_> local_30 [4];
  int local_c;
  int *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  poVar1 = std::operator<<((ostream *)&std::cerr,"h begin: ");
  local_40 = std::chrono::_V2::system_clock::now();
  local_38 = (rep)std::chrono::operator-(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  poVar1 = std::operator<<(poVar1," s=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x12099f);
  *local_8 = local_c + *local_8;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  poVar1 = std::operator<<((ostream *)&std::cerr,"h finish: ");
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_50);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x120aa5);
  return;
}

Assistant:

void h(int &i, int s) {
  LOG("h begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i << " s=" << s );
  
  i += s;  
  
  LOG("h finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}